

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.h
# Opt level: O3

LinkedList<int> * __thiscall LinkedList<int>::operator=(LinkedList<int> *this,LinkedList<int> *copy)

{
  Node<int> *pNVar1;
  LinkedList<int> *pLVar2;
  Node<int> *pNVar3;
  LinkedList<int> *pLVar4;
  LinkedList<int> *pLVar5;
  
  this->size = copy->size;
  pNVar3 = this->head;
  if (this->head == (Node<int> *)0x0) {
    pLVar5 = (LinkedList<int> *)0x0;
  }
  else {
    do {
      pNVar1 = pNVar3->next;
      operator_delete(pNVar3,0x10);
      pNVar3 = pNVar1;
    } while (pNVar1 != (Node<int> *)0x0);
    pLVar5 = (LinkedList<int> *)this->head;
  }
  pNVar3 = copy->head;
  pLVar4 = (LinkedList<int> *)this->tail;
  do {
    pNVar1 = pNVar3->next;
    pLVar2 = (LinkedList<int> *)operator_new(0x10);
    *(undefined8 *)pLVar2 = 0;
    pLVar2->head = (Node<int> *)0x0;
    pLVar2->size = pNVar3->data;
    if (pLVar5 == (LinkedList<int> *)0x0) {
      pLVar5 = pLVar2;
      pLVar4 = this;
    }
    pLVar4->head = (Node<int> *)pLVar2;
    this->tail = (Node<int> *)pLVar2;
    pNVar3 = pNVar1;
    pLVar4 = pLVar2;
  } while( true );
}

Assistant:

LinkedList<T>& LinkedList<T>::operator=(const LinkedList &copy)
{
    auto curr = head;
    size = copy.size;

    while(curr != nullptr)
    {
        auto currNext = curr->next;
        delete curr;
        curr = currNext;
    }

    curr = copy.head;
    while(curr != nullptr)
    {
        auto currNext = curr->next;
        auto *node = new Node<T>();
        node->data = curr->data;
        node->next = nullptr;

        if(head == nullptr)
        {
            head = node;
            tail = node;
        } else
        {
            tail->next = node;
            tail = node;
        }
        curr = currNext;
    }
}